

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<TFad<6,_double>_>::Subst_Diag
          (TPZMatrix<TFad<6,_double>_> *this,TPZFMatrix<TFad<6,_double>_> *B)

{
  long lVar1;
  long lVar2;
  TFadExpr<TFadBinaryDiv<TFad<6,_double>,_TFad<6,_double>_>_> *pTVar3;
  TPZBaseMatrix *pTVar4;
  int iVar5;
  TFad<6,_double> *e1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int64_t iVar6;
  TPZBaseMatrix *in_RSI;
  TFad<6,_double> *in_RDI;
  char *in_stack_000000b8;
  char *in_stack_000000c0;
  int64_t c;
  TFad<6,_double> pivot;
  int64_t r;
  TFadExpr<TFadBinaryDiv<TFad<6,_double>,_TFad<6,_double>_>_> *fadexpr;
  undefined1 local_100 [80];
  undefined1 local_b0 [80];
  long local_60;
  undefined1 local_58 [64];
  TFadExpr<TFadBinaryDiv<TFad<6,_double>,_TFad<6,_double>_>_> *local_18;
  TPZBaseMatrix *local_10;
  
  local_10 = in_RSI;
  e1 = (TFad<6,_double> *)TPZBaseMatrix::Rows(in_RSI);
  iVar5 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0xc])();
  if (e1 != (TFad<6,_double> *)CONCAT44(extraout_var,iVar5)) {
    Error(in_stack_000000c0,in_stack_000000b8);
  }
  local_18 = (TFadExpr<TFadBinaryDiv<TFad<6,_double>,_TFad<6,_double>_>_> *)0x0;
  while( true ) {
    fadexpr = local_18;
    iVar5 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0xc])();
    if (CONCAT44(extraout_var_00,iVar5) <= (long)fadexpr) break;
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_58,in_RDI,local_18,local_18);
    local_60 = 0;
    while( true ) {
      lVar1 = local_60;
      iVar6 = TPZBaseMatrix::Cols(local_10);
      pTVar4 = local_10;
      pTVar3 = local_18;
      lVar2 = local_60;
      if (iVar6 <= lVar1) break;
      (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(local_100);
      ::operator/(e1,in_RDI);
      TFad<6,double>::TFad<TFadBinaryDiv<TFad<6,double>,TFad<6,double>>>(in_RDI,fadexpr);
      (*(pTVar4->super_TPZSavable)._vptr_TPZSavable[0x23])(pTVar4,pTVar3,lVar2,local_b0);
      TFad<6,_double>::~TFad((TFad<6,_double> *)0x131a2e8);
      TFadExpr<TFadBinaryDiv<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
                ((TFadExpr<TFadBinaryDiv<TFad<6,_double>,_TFad<6,_double>_>_> *)0x131a2f5);
      TFad<6,_double>::~TFad((TFad<6,_double> *)0x131a2ff);
      local_60 = local_60 + 1;
    }
    TFad<6,_double>::~TFad((TFad<6,_double> *)0x131a3a4);
    local_18 = (TFadExpr<TFadBinaryDiv<TFad<6,_double>,_TFad<6,_double>_>_> *)
               ((long)&(local_18->fadexpr_).left_ + 1);
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_Diag( TPZFMatrix<TVar> *B ) const {
    if ( (B->Rows() != Dim())) {
        Error("TPZMatrix::Subst_Diag incompatible dimensions\n");
	}
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols(); c++ ) {
			B->PutVal( r, c, B->GetVal( r, c ) / pivot );
		}
	}
	return( 1 );
}